

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O0

int svb_find_avx_d1_init
              (uint8_t *keyPtr,uint8_t *dataPtr,uint64_t count,uint32_t prev,uint32_t key,
              uint32_t *presult)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  undefined1 auVar9 [16];
  byte bVar10;
  int iVar11;
  xmm_t *PrevLow_00;
  ulong uVar12;
  uint in_ECX;
  ulong uVar13;
  ulong in_RDX;
  xmm_t *palVar14;
  xmm_t *PrevHi_00;
  xmm_t *PrevHi_01;
  xmm_t *PrevHi_02;
  xmm_t *extraout_RDX;
  xmm_t *PrevHi_03;
  xmm_t *PrevHi_04;
  xmm_t *PrevHi_05;
  undefined1 (*in_RSI) [16];
  undefined1 (**ppauVar15) [16];
  undefined1 (**ppauVar16) [16];
  uint uVar17;
  long in_RDI;
  ulong uVar18;
  uint32_t in_R8D;
  uint32_t *in_R9;
  longlong lVar19;
  longlong lVar20;
  xmm_t Vec;
  xmm_t Vec_00;
  xmm_t Vec_01;
  xmm_t Vec_02;
  xmm_t Vec_03;
  xmm_t Vec_04;
  xmm_t Vec_05;
  xmm_t Vec_06;
  xmm_t Vec_07;
  xmm_t Vec_08;
  xmm_t Vec_09;
  xmm_t Vec_10;
  xmm_t Vec_11;
  xmm_t Vec_12;
  xmm_t Vec_13;
  xmm_t Vec_14;
  xmm_t Vec_15;
  xmm_t Vec_16;
  xmm_t Vec_17;
  xmm_t Vec_18;
  xmm_t Vec_19;
  xmm_t Vec_20;
  xmm_t Vec_21;
  xmm_t alVar21;
  xmm_t Prev;
  xmm_t Prev_00;
  xmm_t Prev_01;
  xmm_t Prev_02;
  xmm_t Prev_03;
  xmm_t Prev_04;
  xmm_t Prev_05;
  xmm_t Prev_06;
  xmm_t Prev_07;
  xmm_t Prev_08;
  xmm_t Prev_09;
  xmm_t Prev_10;
  xmm_t Prev_11;
  xmm_t Prev_12;
  xmm_t Prev_13;
  xmm_t Prev_14;
  int s_16;
  uint32_t out [32];
  uint64_t consumedkeys;
  uint32_t keysleft;
  int s_15;
  int s_14;
  int s_13;
  int s_12;
  int s_11;
  int s_10;
  int s_9;
  int s_8;
  uint64_t keys_1;
  int s_7;
  int s_6;
  int s_5;
  int s_4;
  int s_3;
  int s_2;
  int s_1;
  int s;
  uint64_t keys;
  uint64_t nextkeys;
  uint64_t *keyPtr64;
  int64_t Offset;
  xmm_t Data;
  xmm_t PrevLow;
  xmm_t PrevHi;
  int consumedInts;
  uint64_t keybytes;
  undefined1 (**in_stack_fffffffffffffd40) [16];
  undefined1 (**in_stack_fffffffffffffd48) [16];
  undefined1 (**in_stack_fffffffffffffd50) [16];
  undefined1 (**in_stack_fffffffffffffd58) [16];
  uint32_t local_278 [34];
  long local_1f0;
  uint local_1e4;
  undefined8 local_1c0;
  undefined8 local_198;
  ulong local_190;
  long local_188;
  xmm_t *local_180;
  undefined1 local_178 [16];
  longlong local_168;
  longlong lStack_160;
  longlong local_158;
  undefined8 uStack_150;
  int local_144;
  ulong local_140;
  uint32_t *local_138;
  uint32_t local_130;
  uint local_12c;
  ulong local_128;
  undefined1 (*local_120 [3]) [16];
  ulong local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 (*local_80) [16];
  undefined1 (*local_78) [16];
  undefined1 (*local_70) [16];
  undefined1 (*local_68) [16];
  undefined1 (*local_60) [16];
  undefined1 (*local_58) [16];
  undefined1 (*local_50) [16];
  ulong local_48;
  undefined8 uStack_40;
  ulong *local_30;
  undefined1 local_28 [16];
  
  local_140 = in_RDX >> 2;
  local_144 = 0;
  local_138 = in_R9;
  local_130 = in_R8D;
  local_12c = in_ECX;
  local_128 = in_RDX;
  local_120[0] = in_RSI;
  if (7 < local_140) {
    auVar9 = vpinsrd_avx(ZEXT416(in_ECX),in_ECX,1);
    auVar9 = vpinsrd_avx(auVar9,in_ECX,2);
    local_28 = vpinsrd_avx(auVar9,in_ECX,3);
    local_158 = local_28._0_8_;
    uStack_150 = local_28._8_8_;
    palVar14 = (xmm_t *)((long)-local_140 % 8);
    PrevLow_00 = (xmm_t *)((long)-local_140 / 8 + 1);
    local_188 = in_RDI + (long)PrevLow_00 * -8;
    local_190 = *(ulong *)(local_188 + (long)PrevLow_00 * 8);
    lVar19 = local_28._0_8_;
    lVar20 = local_28._8_8_;
    for (local_180 = PrevLow_00; uVar13 = local_198, local_198._0_1_ = (byte)local_190,
        bVar10 = (byte)local_198, local_180 != (xmm_t *)0x0;
        local_180 = (xmm_t *)((long)*local_180 + 1)) {
      local_198 = local_190;
      uVar13 = *(ulong *)(local_188 + 8 + (long)local_180 * 8);
      if (local_190 == 0) {
        local_50 = local_120[0];
        local_98 = vlddqu_avx(*local_120[0]);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_98._0_8_;
        local_178 = vpmovzxbw_avx(auVar9);
        Vec[1] = (longlong)&local_168;
        Vec[0] = (longlong)&local_158;
        local_190 = uVar13;
        _scan_16bit_avx_d1(Vec,palVar14,local_180);
        if (local_130 <= uStack_150._4_4_) {
          iVar11 = find_lower_bound((__m128i *)&local_158,(__m128i *)&local_168,local_130,local_138)
          ;
          return local_144 + iVar11;
        }
        local_58 = (undefined1 (*) [16])(*local_120[0] + 8);
        local_a8 = vlddqu_avx(*local_58);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_a8._0_8_;
        local_178 = vpmovzxbw_avx(auVar1);
        Vec_00[1] = (longlong)&local_168;
        Vec_00[0] = (longlong)&local_158;
        _scan_16bit_avx_d1(Vec_00,PrevHi_00,(xmm_t *)(ulong)uStack_150._4_4_);
        if (local_130 <= uStack_150._4_4_) {
          iVar11 = find_lower_bound((__m128i *)&local_158,(__m128i *)&local_168,local_130,local_138)
          ;
          return local_144 + 8 + iVar11;
        }
        local_60 = local_120[0] + 1;
        local_b8 = vlddqu_avx(*local_60);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_b8._0_8_;
        local_178 = vpmovzxbw_avx(auVar2);
        Vec_01[1] = (longlong)&local_168;
        Vec_01[0] = (longlong)&local_158;
        _scan_16bit_avx_d1(Vec_01,PrevHi_01,(xmm_t *)(ulong)uStack_150._4_4_);
        if (local_130 <= uStack_150._4_4_) {
          iVar11 = find_lower_bound((__m128i *)&local_158,(__m128i *)&local_168,local_130,local_138)
          ;
          return local_144 + 0x10 + iVar11;
        }
        local_68 = (undefined1 (*) [16])(local_120[0][1] + 8);
        local_c8 = vlddqu_avx(*local_68);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_c8._0_8_;
        local_178 = vpmovzxbw_avx(auVar3);
        Vec_02[1] = (longlong)&local_168;
        Vec_02[0] = (longlong)&local_158;
        lVar19 = local_178._0_8_;
        lVar20 = local_178._8_8_;
        _scan_16bit_avx_d1(Vec_02,PrevHi_02,(xmm_t *)(ulong)uStack_150._4_4_);
        if (local_130 <= uStack_150._4_4_) {
          iVar11 = find_lower_bound((__m128i *)&local_158,(__m128i *)&local_168,local_130,local_138)
          ;
          return local_144 + 0x18 + iVar11;
        }
        local_120[0] = local_120[0] + 2;
        palVar14 = extraout_RDX;
        uVar17 = uStack_150._4_4_;
      }
      else {
        uVar12 = local_190 & 0xff;
        ppauVar15 = local_120;
        palVar14 = local_180;
        ppauVar16 = ppauVar15;
        local_190 = uVar13;
        alVar21 = _decode_avx((uint)bVar10,(uint8_t **)ppauVar15);
        Prev[0] = alVar21[1];
        alVar21[1] = (longlong)ppauVar16;
        alVar21[0] = uVar12;
        Prev[1] = (longlong)palVar14;
        local_178._0_8_ = lVar19;
        local_178._8_8_ = lVar20;
        _scan_avx_d1(alVar21,Prev);
        uVar13 = (ulong)local_198._1_1_;
        local_168 = lVar19;
        lStack_160 = lVar20;
        alVar21 = _decode_avx((uint)local_198._1_1_,(uint8_t **)ppauVar15);
        Prev_00[0] = alVar21[1];
        Vec_03[1] = (longlong)ppauVar15;
        Vec_03[0] = uVar13;
        Prev_00[1] = (longlong)palVar14;
        local_178._0_8_ = lVar19;
        local_178._8_8_ = lVar20;
        _scan_avx_d1(Vec_03,Prev_00);
        uStack_150._4_4_ = (uint)((ulong)lVar20 >> 0x20);
        uVar13 = (ulong)uStack_150._4_4_;
        local_158 = lVar19;
        uStack_150 = lVar20;
        if (local_130 <= uStack_150._4_4_) {
          iVar11 = find_lower_bound((__m128i *)&local_158,(__m128i *)&local_168,local_130,local_138)
          ;
          return local_144 + iVar11;
        }
        uVar12 = local_198 >> 0x10;
        local_198._0_1_ = (byte)(local_198 >> 0x10);
        uVar18 = uVar12 & 0xff;
        ppauVar15 = local_120;
        uVar17 = (uint)(byte)local_198;
        ppauVar16 = ppauVar15;
        local_198 = uVar12;
        alVar21 = _decode_avx(uVar17,(uint8_t **)ppauVar15);
        Prev_01[0] = alVar21[1];
        Vec_04[1] = (longlong)ppauVar16;
        Vec_04[0] = uVar18;
        Prev_01[1] = uVar13;
        local_178._0_8_ = lVar19;
        local_178._8_8_ = lVar20;
        _scan_avx_d1(Vec_04,Prev_01);
        uVar12 = (ulong)local_198._1_1_;
        local_168 = lVar19;
        lStack_160 = lVar20;
        alVar21 = _decode_avx((uint)local_198._1_1_,(uint8_t **)ppauVar15);
        Prev_02[0] = alVar21[1];
        Vec_05[1] = (longlong)ppauVar15;
        Vec_05[0] = uVar12;
        Prev_02[1] = uVar13;
        local_178._0_8_ = lVar19;
        local_178._8_8_ = lVar20;
        _scan_avx_d1(Vec_05,Prev_02);
        uStack_150._4_4_ = (uint)((ulong)lVar20 >> 0x20);
        uVar13 = (ulong)uStack_150._4_4_;
        local_158 = lVar19;
        uStack_150 = lVar20;
        if (local_130 <= uStack_150._4_4_) {
          iVar11 = find_lower_bound((__m128i *)&local_158,(__m128i *)&local_168,local_130,local_138)
          ;
          return local_144 + 8 + iVar11;
        }
        uVar12 = local_198 >> 0x10;
        local_198._0_1_ = (byte)(local_198 >> 0x10);
        uVar18 = uVar12 & 0xff;
        ppauVar15 = local_120;
        uVar17 = (uint)(byte)local_198;
        ppauVar16 = ppauVar15;
        local_198 = uVar12;
        alVar21 = _decode_avx(uVar17,(uint8_t **)ppauVar15);
        Prev_03[0] = alVar21[1];
        Vec_06[1] = (longlong)ppauVar16;
        Vec_06[0] = uVar18;
        Prev_03[1] = uVar13;
        local_178._0_8_ = lVar19;
        local_178._8_8_ = lVar20;
        _scan_avx_d1(Vec_06,Prev_03);
        uVar12 = (ulong)local_198._1_1_;
        local_168 = lVar19;
        lStack_160 = lVar20;
        alVar21 = _decode_avx((uint)local_198._1_1_,(uint8_t **)ppauVar15);
        Prev_04[0] = alVar21[1];
        Vec_07[1] = (longlong)ppauVar15;
        Vec_07[0] = uVar12;
        Prev_04[1] = uVar13;
        local_178._0_8_ = lVar19;
        local_178._8_8_ = lVar20;
        _scan_avx_d1(Vec_07,Prev_04);
        uStack_150._4_4_ = (uint)((ulong)lVar20 >> 0x20);
        uVar13 = (ulong)uStack_150._4_4_;
        local_158 = lVar19;
        uStack_150 = lVar20;
        if (local_130 <= uStack_150._4_4_) {
          iVar11 = find_lower_bound((__m128i *)&local_158,(__m128i *)&local_168,local_130,local_138)
          ;
          return local_144 + 0x10 + iVar11;
        }
        uVar12 = local_198 >> 0x10;
        local_198._0_1_ = (byte)(local_198 >> 0x10);
        uVar18 = uVar12 & 0xff;
        ppauVar15 = local_120;
        uVar17 = (uint)(byte)local_198;
        ppauVar16 = ppauVar15;
        local_198 = uVar12;
        alVar21 = _decode_avx(uVar17,(uint8_t **)ppauVar15);
        Prev_05[0] = alVar21[1];
        Vec_08[1] = (longlong)ppauVar16;
        Vec_08[0] = uVar18;
        Prev_05[1] = uVar13;
        local_178._0_8_ = lVar19;
        local_178._8_8_ = lVar20;
        _scan_avx_d1(Vec_08,Prev_05);
        uVar12 = (ulong)local_198._1_1_;
        local_168 = lVar19;
        lStack_160 = lVar20;
        alVar21 = _decode_avx((uint)local_198._1_1_,(uint8_t **)ppauVar15);
        Prev_06[0] = alVar21[1];
        local_178._8_8_ = lVar20;
        local_178._0_8_ = lVar19;
        Vec_09[1] = (longlong)ppauVar15;
        Vec_09[0] = uVar12;
        Prev_06[1] = uVar13;
        alVar21 = _scan_avx_d1(Vec_09,Prev_06);
        palVar14 = alVar21[1];
        uStack_150._4_4_ = (uint)((ulong)lVar20 >> 0x20);
        bVar8 = local_130 <= uStack_150._4_4_;
        uVar17 = uStack_150._4_4_;
        local_158 = lVar19;
        uStack_150 = lVar20;
        if (bVar8) {
          iVar11 = find_lower_bound((__m128i *)&local_158,(__m128i *)&local_168,local_130,local_138)
          ;
          return local_144 + 0x18 + iVar11;
        }
      }
      local_144 = local_144 + 0x20;
      PrevLow_00 = (xmm_t *)(ulong)uVar17;
    }
    local_1c0 = local_190;
    local_198 = uVar13;
    if (local_190 == 0) {
      local_70 = local_120[0];
      local_d8 = vlddqu_avx(*local_120[0]);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_d8._0_8_;
      local_178 = vpmovzxbw_avx(auVar4);
      Vec_10[1] = (longlong)&local_168;
      Vec_10[0] = (longlong)&local_158;
      _scan_16bit_avx_d1(Vec_10,palVar14,PrevLow_00);
      if (local_130 <= uStack_150._4_4_) {
        iVar11 = find_lower_bound((__m128i *)&local_158,(__m128i *)&local_168,local_130,local_138);
        return local_144 + iVar11;
      }
      local_78 = (undefined1 (*) [16])(*local_120[0] + 8);
      local_e8 = vlddqu_avx(*local_78);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_e8._0_8_;
      local_178 = vpmovzxbw_avx(auVar5);
      Vec_11[1] = (longlong)&local_168;
      Vec_11[0] = (longlong)&local_158;
      _scan_16bit_avx_d1(Vec_11,PrevHi_03,(xmm_t *)(ulong)uStack_150._4_4_);
      if (local_130 <= uStack_150._4_4_) {
        iVar11 = find_lower_bound((__m128i *)&local_158,(__m128i *)&local_168,local_130,local_138);
        return local_144 + 8 + iVar11;
      }
      local_80 = local_120[0] + 1;
      local_f8 = vlddqu_avx(*local_80);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_f8._0_8_;
      local_178 = vpmovzxbw_avx(auVar6);
      Vec_12[1] = (longlong)&local_168;
      Vec_12[0] = (longlong)&local_158;
      _scan_16bit_avx_d1(Vec_12,PrevHi_04,(xmm_t *)(ulong)uStack_150._4_4_);
      if (local_130 <= uStack_150._4_4_) {
        iVar11 = find_lower_bound((__m128i *)&local_158,(__m128i *)&local_168,local_130,local_138);
        return local_144 + 0x10 + iVar11;
      }
      local_30 = (ulong *)(local_120[0][1] + 8);
      local_108 = *local_30;
      uStack_40 = 0;
      uStack_100 = 0;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_108;
      local_178 = vpmovzxbw_avx(auVar7);
      Vec_13[1] = (longlong)&local_168;
      Vec_13[0] = (longlong)&local_158;
      local_48 = local_108;
      _scan_16bit_avx_d1(Vec_13,PrevHi_05,(xmm_t *)(ulong)uStack_150._4_4_);
      if (local_130 <= uStack_150._4_4_) {
        iVar11 = find_lower_bound((__m128i *)&local_158,(__m128i *)&local_168,local_130,local_138);
        return local_144 + 0x18 + iVar11;
      }
      local_120[0] = local_120[0] + 2;
    }
    else {
      uVar13 = local_190 & 0xff;
      ppauVar15 = local_120;
      uVar17 = (uint)(byte)local_198;
      ppauVar16 = ppauVar15;
      alVar21 = _decode_avx(uVar17,(uint8_t **)ppauVar15);
      Prev_07[0] = alVar21[1];
      Vec_14[1] = (longlong)ppauVar15;
      Vec_14[0] = uVar13;
      Prev_07[1] = (longlong)PrevLow_00;
      local_178._0_8_ = lVar19;
      local_178._8_8_ = lVar20;
      _scan_avx_d1(Vec_14,Prev_07);
      uVar13 = (ulong)local_1c0._1_1_;
      in_stack_fffffffffffffd58 = ppauVar16;
      local_168 = lVar19;
      lStack_160 = lVar20;
      alVar21 = _decode_avx((uint)local_1c0._1_1_,(uint8_t **)ppauVar16);
      Prev_08[0] = alVar21[1];
      Vec_15[1] = (longlong)ppauVar16;
      Vec_15[0] = uVar13;
      Prev_08[1] = (longlong)PrevLow_00;
      local_178._0_8_ = lVar19;
      local_178._8_8_ = lVar20;
      _scan_avx_d1(Vec_15,Prev_08);
      uStack_150._4_4_ = (uint)((ulong)lVar20 >> 0x20);
      uVar13 = (ulong)uStack_150._4_4_;
      local_158 = lVar19;
      uStack_150 = lVar20;
      if (local_130 <= uStack_150._4_4_) {
        iVar11 = find_lower_bound((__m128i *)&local_158,(__m128i *)&local_168,local_130,local_138);
        return local_144 + iVar11;
      }
      uVar12 = local_1c0 >> 0x10;
      local_1c0._0_1_ = (byte)(local_1c0 >> 0x10);
      uVar18 = uVar12 & 0xff;
      ppauVar15 = local_120;
      uVar17 = (uint)(byte)local_1c0;
      ppauVar16 = ppauVar15;
      local_1c0 = uVar12;
      alVar21 = _decode_avx(uVar17,(uint8_t **)ppauVar15);
      Prev_09[0] = alVar21[1];
      Vec_16[1] = (longlong)ppauVar15;
      Vec_16[0] = uVar18;
      Prev_09[1] = uVar13;
      local_178._0_8_ = lVar19;
      local_178._8_8_ = lVar20;
      _scan_avx_d1(Vec_16,Prev_09);
      uVar12 = (ulong)local_1c0._1_1_;
      in_stack_fffffffffffffd50 = ppauVar16;
      local_168 = lVar19;
      lStack_160 = lVar20;
      alVar21 = _decode_avx((uint)local_1c0._1_1_,(uint8_t **)ppauVar16);
      Prev_10[0] = alVar21[1];
      Vec_17[1] = (longlong)ppauVar16;
      Vec_17[0] = uVar12;
      Prev_10[1] = uVar13;
      local_178._0_8_ = lVar19;
      local_178._8_8_ = lVar20;
      _scan_avx_d1(Vec_17,Prev_10);
      uStack_150._4_4_ = (uint)((ulong)lVar20 >> 0x20);
      uVar13 = (ulong)uStack_150._4_4_;
      local_158 = lVar19;
      uStack_150 = lVar20;
      if (local_130 <= uStack_150._4_4_) {
        iVar11 = find_lower_bound((__m128i *)&local_158,(__m128i *)&local_168,local_130,local_138);
        return local_144 + 8 + iVar11;
      }
      uVar12 = local_1c0 >> 0x10;
      local_1c0._0_1_ = (byte)(local_1c0 >> 0x10);
      uVar18 = uVar12 & 0xff;
      ppauVar15 = local_120;
      uVar17 = (uint)(byte)local_1c0;
      ppauVar16 = ppauVar15;
      local_1c0 = uVar12;
      alVar21 = _decode_avx(uVar17,(uint8_t **)ppauVar15);
      Prev_11[0] = alVar21[1];
      Vec_18[1] = (longlong)ppauVar15;
      Vec_18[0] = uVar18;
      Prev_11[1] = uVar13;
      local_178._0_8_ = lVar19;
      local_178._8_8_ = lVar20;
      _scan_avx_d1(Vec_18,Prev_11);
      uVar12 = (ulong)local_1c0._1_1_;
      in_stack_fffffffffffffd48 = ppauVar16;
      local_168 = lVar19;
      lStack_160 = lVar20;
      alVar21 = _decode_avx((uint)local_1c0._1_1_,(uint8_t **)ppauVar16);
      Prev_12[0] = alVar21[1];
      Vec_19[1] = (longlong)ppauVar16;
      Vec_19[0] = uVar12;
      Prev_12[1] = uVar13;
      local_178._0_8_ = lVar19;
      local_178._8_8_ = lVar20;
      _scan_avx_d1(Vec_19,Prev_12);
      uStack_150._4_4_ = (uint)((ulong)lVar20 >> 0x20);
      uVar13 = (ulong)uStack_150._4_4_;
      local_158 = lVar19;
      uStack_150 = lVar20;
      if (local_130 <= uStack_150._4_4_) {
        iVar11 = find_lower_bound((__m128i *)&local_158,(__m128i *)&local_168,local_130,local_138);
        return local_144 + 0x10 + iVar11;
      }
      uVar12 = local_1c0 >> 0x10;
      local_1c0._0_1_ = (byte)(local_1c0 >> 0x10);
      uVar18 = uVar12 & 0xff;
      ppauVar15 = local_120;
      uVar17 = (uint)(byte)local_1c0;
      ppauVar16 = ppauVar15;
      local_1c0 = uVar12;
      alVar21 = _decode_avx(uVar17,(uint8_t **)ppauVar15);
      Prev_13[0] = alVar21[1];
      Vec_20[1] = (longlong)ppauVar15;
      Vec_20[0] = uVar18;
      Prev_13[1] = uVar13;
      local_178._0_8_ = lVar19;
      local_178._8_8_ = lVar20;
      _scan_avx_d1(Vec_20,Prev_13);
      uVar12 = (ulong)local_1c0._1_1_;
      in_stack_fffffffffffffd40 = ppauVar16;
      local_168 = lVar19;
      lStack_160 = lVar20;
      alVar21 = _decode_avx((uint)local_1c0._1_1_,(uint8_t **)ppauVar16);
      Prev_14[0] = alVar21[1];
      local_178._8_8_ = lVar20;
      local_178._0_8_ = lVar19;
      Vec_21[1] = (longlong)ppauVar16;
      Vec_21[0] = uVar12;
      Prev_14[1] = uVar13;
      _scan_avx_d1(Vec_21,Prev_14);
      uStack_150._4_4_ = (uint)((ulong)lVar20 >> 0x20);
      bVar8 = local_130 <= uStack_150._4_4_;
      local_158 = lVar19;
      uStack_150 = lVar20;
      if (bVar8) {
        iVar11 = find_lower_bound((__m128i *)&local_158,(__m128i *)&local_168,local_130,local_138);
        return local_144 + 0x18 + iVar11;
      }
    }
    local_144 = local_144 + 0x20;
    local_12c = uStack_150._4_4_;
  }
  local_1e4 = (uint)local_128 & 0x1f;
  if ((local_128 & 0x1f) != 0) {
    local_1f0 = local_140 - (local_140 & 7);
    svb_decode_scalar_d1_init
              ((uint32_t *)in_stack_fffffffffffffd58,(uint8_t *)in_stack_fffffffffffffd50,
               (uint8_t *)in_stack_fffffffffffffd48,
               (uint32_t)((ulong)in_stack_fffffffffffffd40 >> 0x20),
               (uint32_t)in_stack_fffffffffffffd40);
    if (local_130 <= local_278[local_1e4 - 1]) {
      iVar11 = lower_bound(local_278,local_130,0,local_1e4);
      *local_138 = local_278[iVar11];
      return local_144 + iVar11;
    }
  }
  *local_138 = local_130 + 1;
  return (uint)local_128;
}

Assistant:

int svb_find_avx_d1_init(uint8_t *keyPtr, uint8_t *dataPtr, uint64_t count,
                         uint32_t prev, uint32_t key, uint32_t *presult) {
  uint64_t keybytes = count / 4; // number of key bytes
  int consumedInts = 0;

  if (keybytes >= 8) {
    xmm_t PrevHi = _mm_set1_epi32(prev);
    xmm_t PrevLow;
    xmm_t Data;

    int64_t Offset = -(int64_t)keybytes / 8 + 1;

    const uint64_t *keyPtr64 = (const uint64_t *)keyPtr - Offset;
    uint64_t nextkeys = keyPtr64[Offset];
    for (; Offset != 0; ++Offset) {
      uint64_t keys = nextkeys;
      nextkeys = keyPtr64[Offset + 1];
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 8 + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 16 + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 24)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 24 + s);
        }
        dataPtr += 32;
        consumedInts += 32;
        continue;
      }

      Data = _decode_avx(keys & 0x00FF, &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
        int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
        return (consumedInts + s);
      }

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
        int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
        return (consumedInts + 8 + s);
      }

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
        int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
        return (consumedInts + 16 + s);
      }

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
        int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
        return (consumedInts + 24 + s);
      }

      consumedInts += 32;
    }
    {
      uint64_t keys = nextkeys;
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 8 + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 16 + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_loadl_epi64((xmm_t *)(dataPtr + 24)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 24 + s);
        }

        dataPtr += 32;
        consumedInts += 32;

      } else {

        Data = _decode_avx(keys & 0x00FF, &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + s);
        }

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 8 + s);
        }

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 16 + s);
        }

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 24 + s);
        }

        consumedInts += 32;
      }
      // extract the highest integer which was stored so far;
      // it will be the "prev" value for the remaining data
      prev = (uint32_t)_mm_extract_epi32(PrevHi, 3);
    }
  }
  uint32_t keysleft = count & 31;
  if (keysleft > 0) {
    uint64_t consumedkeys = keybytes - (keybytes & 7);
    uint32_t out[32];
    svb_decode_scalar_d1_init(out, keyPtr + consumedkeys, dataPtr, keysleft,
                              prev);
    if (key <= out[keysleft - 1]) {
      int s = lower_bound(out, key, 0, keysleft);
      assert(s >= 0 && s < (int)keysleft);
      *presult = out[s];
      return (consumedInts + s);
    }
  }

  // key was not found!
  *presult = key + 1;
  return (int)count;
}